

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::create_group_ops
          (ConvolutionDepthWise_x86_avx2 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  _func_int *p_Var3;
  pointer ppLVar4;
  pointer ppLVar5;
  ulong uVar6;
  Layer *pLVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int i;
  long lVar11;
  int i_00;
  Mat weight_data_int8_scales_g;
  Mat local_2a8;
  size_t local_260;
  Option *local_258;
  undefined1 *local_250;
  size_t local_248;
  Mat weight_data_g;
  ParamDict pd;
  Mat bias_data_g;
  Mat weights [5];
  
  p_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
  iVar9 = *(int *)(&this->field_0xd0 + (long)p_Var3);
  iVar10 = *(int *)(&this->field_0xd8 + (long)p_Var3) * *(int *)(&this->field_0xd4 + (long)p_Var3);
  iVar1 = *(int *)(&this->field_0x108 + (long)p_Var3);
  uVar6 = (long)*(int *)(&this->field_0x104 + (long)p_Var3) / (long)iVar1;
  uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)iVar10;
  lVar11 = 0;
  local_258 = opt;
  while( true ) {
    ppLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3) <= lVar11) break;
    if (ppLVar4[lVar11] != (Layer *)0x0) {
      (*ppLVar4[lVar11]->_vptr_Layer[1])();
    }
    lVar11 = lVar11 + 1;
  }
  if (ppLVar5 != ppLVar4) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar4;
  }
  iVar2 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
  i_00 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) / iVar2;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(&this->group_ops,(long)iVar2);
  local_250 = &this->field_0x118;
  iVar9 = (((int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                 (long)(iVar9 / iVar1)) * iVar1) / iVar2) * iVar10 * i_00;
  local_248 = (size_t)iVar9;
  local_260 = (size_t)i_00;
  lVar11 = 0;
  while( true ) {
    p_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
    if (*(int *)(&this->field_0x108 + (long)p_Var3) <= lVar11) break;
    weight_data_g.elemsize = *(size_t *)(&this->field_0x178 + (long)p_Var3);
    weight_data_g.data =
         (void *)(lVar11 * local_248 * weight_data_g.elemsize +
                 *(long *)(&this->field_0x168 + (long)p_Var3));
    weight_data_g.elempack = *(int *)(&this->field_0x180 + (long)p_Var3);
    weight_data_g.allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var3);
    weight_data_g.refcount = (int *)0x0;
    weight_data_g.dims = 1;
    weight_data_g.w = (int)local_248;
    weight_data_g.h = 1;
    weight_data_g.d = 1;
    bias_data_g.cstep = 0;
    weight_data_g.cstep = local_248;
    bias_data_g.data = (void *)0x0;
    bias_data_g.refcount._0_4_ = 0;
    bias_data_g.refcount._4_4_ = 0;
    bias_data_g.elemsize._0_4_ = 0;
    bias_data_g._20_8_ = 0;
    bias_data_g.h = 0;
    bias_data_g.d = 0;
    bias_data_g.c = 0;
    bias_data_g.allocator = (Allocator *)0x0;
    bias_data_g.dims = 0;
    bias_data_g.w = 0;
    p_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
    weight_data_g.c = weight_data_g.dims;
    if (*(int *)(&this->field_0x100 + (long)p_Var3) != 0) {
      weights[0].elemsize = *(size_t *)(&this->field_0x1c0 + (long)p_Var3);
      weights[0].data =
           (void *)(lVar11 * local_260 * weights[0].elemsize +
                   *(long *)(&this->field_0x1b0 + (long)p_Var3));
      weights[0].elempack = *(int *)(&this->field_0x1c8 + (long)p_Var3);
      weights[0].allocator = *(Allocator **)(&this->field_0x1d0 + (long)p_Var3);
      weights[0].refcount = (int *)0x0;
      weights[0].dims = 1;
      weights[0].h = 1;
      weights[0].d = 1;
      weights[0].cstep = local_260;
      weights[0].w = i_00;
      weights[0].c = weights[0].dims;
      Mat::operator=(&bias_data_g,weights);
      Mat::~Mat(weights);
    }
    pLVar7 = create_layer(6);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,i_00);
    ParamDict::set(&pd,1,*(int *)(&this->field_0xd4 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    ParamDict::set(&pd,0xb,*(int *)(&this->field_0xd8 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    ParamDict::set(&pd,2,*(int *)(&this->field_0xdc +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    ParamDict::set(&pd,0xc,*(int *)(&this->field_0xe0 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    ParamDict::set(&pd,3,*(int *)(&this->field_0xe4 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    ParamDict::set(&pd,0xd,*(int *)(&this->field_0xe8 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    ParamDict::set(&pd,4,0);
    ParamDict::set(&pd,0xe,0);
    ParamDict::set(&pd,5,*(int *)(&this->field_0x100 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    ParamDict::set(&pd,6,iVar9);
    ParamDict::set(&pd,8,*(int *)(&this->field_0x10c +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    ParamDict::set(&pd,9,*(int *)(&this->field_0x110 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    ParamDict::set(&pd,10,(Mat *)(local_250 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    (*pLVar7->_vptr_Layer[2])(pLVar7,&pd);
    if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) == 0) {
      lVar8 = 0x40;
      do {
        *(undefined8 *)((long)&weights[0].data + lVar8) = 0;
        *(undefined8 *)((long)&bias_data_g.elemsize + lVar8) = 0;
        *(undefined8 *)((long)&bias_data_g.elempack + lVar8) = 0;
        *(undefined8 *)(&bias_data_g.field_0x1c + lVar8) = 0;
        *(undefined8 *)((long)&bias_data_g.allocator + lVar8 + 4) = 0;
        *(undefined8 *)((long)&bias_data_g.h + lVar8) = 0;
        *(undefined8 *)((long)&bias_data_g.c + lVar8) = 0;
        *(undefined8 *)(&bias_data_g.field_0x3c + lVar8) = 0;
        *(undefined8 *)((long)&bias_data_g.cstep + lVar8 + 4) = 0;
        lVar8 = lVar8 + 0x48;
      } while (lVar8 != 0x160);
      Mat::operator=(weights,&weight_data_g);
      if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) != 0) {
        Mat::Mat(&weight_data_int8_scales_g,i_00,4,(Allocator *)0x0);
        Mat::fill(&weight_data_int8_scales_g,
                  *(float *)(*(long *)(&this->field_0x1f8 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) +
                            lVar11 * 4));
        Mat::operator=(weights + 1,&weight_data_int8_scales_g);
        p_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
        local_2a8.elemsize = *(size_t *)(&this->field_0x250 + (long)p_Var3);
        local_2a8.data =
             (void *)(local_2a8.elemsize * lVar11 + *(long *)(&this->field_0x240 + (long)p_Var3));
        local_2a8.elempack = *(int *)(&this->field_0x258 + (long)p_Var3);
        local_2a8.allocator = *(Allocator **)(&this->field_0x260 + (long)p_Var3);
        local_2a8.refcount = (int *)0x0;
        local_2a8.dims = 1;
        local_2a8.w = 1;
        local_2a8.h = 1;
        local_2a8.d = 1;
        local_2a8.c = 1;
        local_2a8.cstep = 1;
        Mat::operator=(weights + 2,&local_2a8);
        Mat::~Mat(&local_2a8);
        Mat::~Mat(&weight_data_int8_scales_g);
        p_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var3)) {
          weight_data_int8_scales_g.elemsize = *(size_t *)(&this->field_0x298 + (long)p_Var3);
          weight_data_int8_scales_g.data =
               (void *)(weight_data_int8_scales_g.elemsize * lVar11 +
                       *(long *)(&this->field_0x288 + (long)p_Var3));
          weight_data_int8_scales_g.elempack = *(int *)(&this->field_0x2a0 + (long)p_Var3);
          weight_data_int8_scales_g.allocator = *(Allocator **)(&this->field_0x2a8 + (long)p_Var3);
          weight_data_int8_scales_g.refcount = (int *)0x0;
          weight_data_int8_scales_g.dims = 1;
          weight_data_int8_scales_g.w = 1;
          weight_data_int8_scales_g.h = 1;
          weight_data_int8_scales_g.d = 1;
          weight_data_int8_scales_g.c = 1;
          weight_data_int8_scales_g.cstep = 1;
          Mat::operator=(weights + 3,&weight_data_int8_scales_g);
          Mat::~Mat(&weight_data_int8_scales_g);
        }
      }
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)&weight_data_int8_scales_g,weights);
      (*pLVar7->_vptr_Layer[3])(pLVar7,&weight_data_int8_scales_g);
      ModelBinFromMatArray::~ModelBinFromMatArray
                ((ModelBinFromMatArray *)&weight_data_int8_scales_g);
      lVar8 = 0xd8;
      do {
        Mat::~Mat((Mat *)((long)&weights[0].data + lVar8));
        lVar8 = lVar8 + -0x48;
      } while (lVar8 != -0x48);
    }
    else {
      lVar8 = 0x40;
      do {
        *(undefined8 *)((long)&weights[0].data + lVar8) = 0;
        *(undefined8 *)((long)&bias_data_g.elemsize + lVar8) = 0;
        *(undefined8 *)((long)&bias_data_g.elempack + lVar8) = 0;
        *(undefined8 *)(&bias_data_g.field_0x1c + lVar8) = 0;
        *(undefined8 *)((long)&bias_data_g.allocator + lVar8 + 4) = 0;
        *(undefined8 *)((long)&bias_data_g.h + lVar8) = 0;
        *(undefined8 *)((long)&bias_data_g.c + lVar8) = 0;
        *(undefined8 *)(&bias_data_g.field_0x3c + lVar8) = 0;
        *(undefined8 *)((long)&bias_data_g.cstep + lVar8 + 4) = 0;
        lVar8 = lVar8 + 0x48;
      } while (lVar8 != 0x1a8);
      Mat::operator=(weights,&weight_data_g);
      Mat::operator=(weights + 1,&bias_data_g);
      if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) != 0) {
        Mat::Mat(&weight_data_int8_scales_g,i_00,4,(Allocator *)0x0);
        Mat::fill(&weight_data_int8_scales_g,
                  *(float *)(*(long *)(&this->field_0x1f8 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) +
                            lVar11 * 4));
        Mat::operator=(weights + 2,&weight_data_int8_scales_g);
        p_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
        local_2a8.elemsize = *(size_t *)(&this->field_0x250 + (long)p_Var3);
        local_2a8.data =
             (void *)(local_2a8.elemsize * lVar11 + *(long *)(&this->field_0x240 + (long)p_Var3));
        local_2a8.elempack = *(int *)(&this->field_0x258 + (long)p_Var3);
        local_2a8.allocator = *(Allocator **)(&this->field_0x260 + (long)p_Var3);
        local_2a8.refcount = (int *)0x0;
        local_2a8.dims = 1;
        local_2a8.w = 1;
        local_2a8.h = 1;
        local_2a8.d = 1;
        local_2a8.c = 1;
        local_2a8.cstep = 1;
        Mat::operator=(weights + 3,&local_2a8);
        Mat::~Mat(&local_2a8);
        Mat::~Mat(&weight_data_int8_scales_g);
        p_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var3)) {
          weight_data_int8_scales_g.elemsize = *(size_t *)(&this->field_0x298 + (long)p_Var3);
          weight_data_int8_scales_g.data =
               (void *)(weight_data_int8_scales_g.elemsize * lVar11 +
                       *(long *)(&this->field_0x288 + (long)p_Var3));
          weight_data_int8_scales_g.elempack = *(int *)(&this->field_0x2a0 + (long)p_Var3);
          weight_data_int8_scales_g.allocator = *(Allocator **)(&this->field_0x2a8 + (long)p_Var3);
          weight_data_int8_scales_g.refcount = (int *)0x0;
          weight_data_int8_scales_g.dims = 1;
          weight_data_int8_scales_g.w = 1;
          weight_data_int8_scales_g.h = 1;
          weight_data_int8_scales_g.d = 1;
          weight_data_int8_scales_g.c = 1;
          weight_data_int8_scales_g.cstep = 1;
          Mat::operator=(weights + 4,&weight_data_int8_scales_g);
          Mat::~Mat(&weight_data_int8_scales_g);
        }
      }
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)&weight_data_int8_scales_g,weights);
      (*pLVar7->_vptr_Layer[3])(pLVar7,&weight_data_int8_scales_g);
      ModelBinFromMatArray::~ModelBinFromMatArray
                ((ModelBinFromMatArray *)&weight_data_int8_scales_g);
      lVar8 = 0x120;
      do {
        Mat::~Mat((Mat *)((long)&weights[0].data + lVar8));
        lVar8 = lVar8 + -0x48;
      } while (lVar8 != -0x48);
    }
    (*pLVar7->_vptr_Layer[4])(pLVar7,local_258);
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar11] = pLVar7;
    ParamDict::~ParamDict(&pd);
    Mat::~Mat(&bias_data_g);
    Mat::~Mat(&weight_data_g);
    lVar11 = lVar11 + 1;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}